

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

void __thiscall Json::FastWriter::writeValue(FastWriter *this,Value *value)

{
  string *psVar1;
  bool bVar2;
  ValueType VVar3;
  ArrayIndex AVar4;
  Json *pJVar5;
  Value *pVVar6;
  char *value_00;
  LargestUInt value_01;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  LargestInt value_02;
  char *pcVar7;
  ArrayIndex index;
  string *key;
  double value_03;
  Members members;
  string local_68;
  Members local_48;
  
  pVVar6 = value;
  VVar3 = Value::type(value);
  switch(VVar3) {
  case nullValue:
    goto LAB_00148143;
  case intValue:
    pJVar5 = (Json *)Value::asLargestInt(value);
    valueToString_abi_cxx11_(&local_68,pJVar5,value_02);
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_68._M_dataplus._M_p);
    break;
  case uintValue:
    pJVar5 = (Json *)Value::asLargestUInt(value);
    valueToString_abi_cxx11_(&local_68,pJVar5,value_01);
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_68._M_dataplus._M_p);
    break;
  case realValue:
    value_03 = Value::asDouble(value);
    valueToString_abi_cxx11_(&local_68,(Json *)pVVar6,value_03);
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_68._M_dataplus._M_p);
    break;
  case stringValue:
    pJVar5 = (Json *)Value::asCString(value);
    valueToQuotedString_abi_cxx11_(&local_68,pJVar5,value_00);
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_68._M_dataplus._M_p);
    break;
  case booleanValue:
    bVar2 = Value::asBool(value);
    pcVar7 = "false";
    if (bVar2) {
      pcVar7 = "true";
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,pcVar7,pcVar7 + ((ulong)bVar2 ^ 5));
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_68._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return;
    }
    goto LAB_0014806c;
  case arrayValue:
    std::__cxx11::string::append((char *)&this->document_);
    AVar4 = Value::size(value);
    if (0 < (int)AVar4) {
      index = 0;
      do {
        if (index != 0) {
          std::__cxx11::string::append((char *)&this->document_);
        }
        pVVar6 = Value::operator[](value,index);
        writeValue(this,pVVar6);
        index = index + 1;
      } while (AVar4 != index);
    }
LAB_00148143:
    std::__cxx11::string::append((char *)&this->document_);
    return;
  case objectValue:
    Value::getMemberNames_abi_cxx11_(&local_48,value);
    psVar1 = &this->document_;
    std::__cxx11::string::append((char *)psVar1);
    pcVar7 = extraout_RDX;
    key = local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        if (key != local_48.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) {
          std::__cxx11::string::append((char *)psVar1);
          pcVar7 = extraout_RDX_00;
        }
        valueToQuotedString_abi_cxx11_(&local_68,(Json *)(key->_M_dataplus)._M_p,pcVar7);
        std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_68._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)psVar1);
        pVVar6 = Value::operator[](value,key);
        writeValue(this,pVVar6);
        key = key + 1;
        pcVar7 = extraout_RDX_01;
      } while (key != local_48.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__cxx11::string::append((char *)psVar1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  default:
    goto switchD_00147eb7_default;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
LAB_0014806c:
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
switchD_00147eb7_default:
  return;
}

Assistant:

void 
FastWriter::writeValue( const Value &value )
{
   switch ( value.type() )
   {
   case nullValue:
      document_ += "null";
      break;
   case intValue:
      document_ += valueToString( value.asLargestInt() );
      break;
   case uintValue:
      document_ += valueToString( value.asLargestUInt() );
      break;
   case realValue:
      document_ += valueToString( value.asDouble() );
      break;
   case stringValue:
      document_ += valueToQuotedString( value.asCString() );
      break;
   case booleanValue:
      document_ += valueToString( value.asBool() );
      break;
   case arrayValue:
      {
         document_ += "[";
         int size = value.size();
         for ( int index =0; index < size; ++index )
         {
            if ( index > 0 )
               document_ += ",";
            writeValue( value[index] );
         }
         document_ += "]";
      }
      break;
   case objectValue:
      {
         Value::Members members( value.getMemberNames() );
         document_ += "{";
         for ( Value::Members::iterator it = members.begin(); 
               it != members.end(); 
               ++it )
         {
            const std::string &name = *it;
            if ( it != members.begin() )
               document_ += ",";
            document_ += valueToQuotedString( name.c_str() );
            document_ += yamlCompatiblityEnabled_ ? ": " 
                                                  : ":";
            writeValue( value[name] );
         }
         document_ += "}";
      }
      break;
   }
}